

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_crypto_two_reg_sha(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  code *pcVar1;
  TCGContext_conflict1 *pTVar2;
  uint uVar3;
  ulong uVar4;
  TCGTemp *pTVar5;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_1;
  TCGv_i64 ret_00;
  
  if ((((insn & 0xc00000) != 0) || (uVar3 = insn >> 0xc & 0x1f, 2 < (ushort)uVar3)) ||
     (uVar4 = (ulong)(uVar3 << 3), (*(ulong *)(&DAT_00d83468 + uVar4) & s->isar->id_aa64isar0) == 0)
     ) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s_00 = s->uc->tcg_ctx;
  pcVar1 = *(code **)((long)&PTR_gen_helper_crypto_sha1h_01074310 + uVar4);
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  pTVar2 = s->uc->tcg_ctx;
  pTVar5 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar5 - (long)pTVar2);
  tcg_gen_addi_i64_aarch64
            (pTVar2,ret,(TCGv_i64)pTVar2->cpu_env,(ulong)((insn & 0x1f) * 0x100 + 0xc10));
  pTVar2 = s->uc->tcg_ctx;
  pTVar5 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar5 - (long)pTVar2);
  tcg_gen_addi_i64_aarch64
            (pTVar2,ret_00,(TCGv_i64)pTVar2->cpu_env,(ulong)((insn & 0x3e0) * 8 + 0xc10));
  (*pcVar1)(s_00,ret,ret_00);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_00 + (long)s_00));
  return;
}

Assistant:

static void disas_crypto_two_reg_sha(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    CryptoTwoOpFn *genfn;
    bool feature;
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr;

    if (size != 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0: /* SHA1H */
        feature = dc_isar_feature(aa64_sha1, s);
        genfn = gen_helper_crypto_sha1h;
        break;
    case 1: /* SHA1SU1 */
        feature = dc_isar_feature(aa64_sha1, s);
        genfn = gen_helper_crypto_sha1su1;
        break;
    case 2: /* SHA256SU0 */
        feature = dc_isar_feature(aa64_sha256, s);
        genfn = gen_helper_crypto_sha256su0;
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);

    genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr);

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
}